

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout_mapping_right.hpp
# Opt level: O2

size_type __thiscall
std::experimental::
layout_mapping_right<std::experimental::dimensions<30ul,15ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
::index<int,int,int>
          (layout_mapping_right<std::experimental::dimensions<30ul,15ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
           *this,int idx,int idx_1,int idx_2)

{
  size_type sVar1;
  layout_mapping_right_indexer<std::experimental::dimensions<30UL,_15UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_0UL,_void>
  indexer;
  layout_mapping_right_indexer<std::experimental::dimensions<30ul,15ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,0ul,void>
  local_19;
  long local_18;
  long lStack_10;
  long local_8;
  
  local_18 = (long)idx;
  lStack_10 = (long)idx_1;
  local_8 = (long)idx_2;
  sVar1 = detail::
          layout_mapping_right_indexer<std::experimental::dimensions<30ul,15ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,0ul,void>
          ::operator()(&local_19);
  return sVar1;
}

Assistant:

inline typename Dimensions::size_type
layout_mapping_right<Dimensions, Stepping, Padding>::index(
    Idx... idx
    ) const noexcept
{
    // TODO: These static asserts need to actually live in mdspan. The
    // first one is particularly important, otherwise it will silently do the
    // wrong thing.
    static_assert(
        Dimensions::rank() == sizeof...(idx)
      , "Incorrect number of indices passed to layout_mapping_right."
    );

    detail::layout_mapping_right_indexer<Dimensions, Stepping, Padding, 0> indexer;
    auto i = detail::make_filled_dims_t<Dimensions::rank(), dyn>(idx...);

    return indexer(*static_cast<Dimensions const*>(this), step_, pad_, i);
}